

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_c1df::read_iostream_range
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  allocator<unsigned_char> local_251;
  undefined1 local_250 [12];
  undefined1 local_240 [2] [12];
  long local_220;
  ifstream file;
  char *file_name_local;
  
  std::ifstream::ifstream(&local_220);
  std::ios::exceptions((int)&local_220 + (int)*(undefined8 *)(local_220 + -0x18));
  std::ifstream::open((char *)&local_220,(_Ios_Openmode)file_name);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_240,
             (istream_type *)&local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_250);
  std::allocator<unsigned_char>::allocator(&local_251);
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_240[0]._0_8_;
  __first._M_c = local_240[0]._8_4_;
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)local_250._0_8_;
  __last._M_c = local_250._8_4_;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             __last,&local_251);
  std::allocator<unsigned_char>::~allocator(&local_251);
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_iostream_range(const char* file_name)
{
    std::ifstream file{};
    file.exceptions(std::ios::badbit);
    file.open(file_name, std::ios_base::binary);

    return std::vector<uint8_t>(std::istreambuf_iterator<char>(file),
                                std::istreambuf_iterator<char>());
}